

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O3

uint __thiscall llvm::StringMapImpl::RehashTable(StringMapImpl *this,uint BucketNo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntryBase **ppSVar4;
  StringMapEntryBase *pSVar5;
  ulong uVar6;
  uint uVar7;
  StringMapEntryBase **ppSVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar6 = (ulong)BucketNo;
  ppSVar4 = this->TheTable;
  uVar1 = this->NumBuckets;
  if (uVar1 * 3 < this->NumItems * 4) {
    uVar14 = (ulong)(uVar1 * 2);
  }
  else {
    uVar14 = (ulong)uVar1;
    if (uVar1 >> 3 < uVar1 - (this->NumItems + this->NumTombstones)) {
      return BucketNo;
    }
  }
  uVar7 = (uint)uVar14;
  ppSVar8 = (StringMapEntryBase **)safe_calloc((ulong)(uVar7 + 1),0xc);
  ppSVar8[uVar14] = (StringMapEntryBase *)0x2;
  uVar2 = this->NumBuckets;
  if ((ulong)uVar2 != 0) {
    uVar11 = 0;
    uVar9 = uVar6;
    do {
      pSVar5 = this->TheTable[uVar11];
      if ((pSVar5 != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (pSVar5 != (StringMapEntryBase *)0x0)) {
        uVar3 = *(uint *)((long)ppSVar4 + uVar11 * 4 + (ulong)uVar1 * 8 + 8);
        uVar13 = (ulong)(uVar3 & uVar7 - 1);
        if (ppSVar8[uVar13] != (StringMapEntryBase *)0x0) {
          iVar10 = 1;
          do {
            uVar12 = (int)uVar13 + iVar10;
            iVar10 = iVar10 + 1;
            uVar13 = (ulong)(uVar12 & uVar7 - 1);
          } while (ppSVar8[uVar13] != (StringMapEntryBase *)0x0);
        }
        ppSVar8[uVar13] = pSVar5;
        *(uint *)((long)ppSVar8 + uVar13 * 4 + uVar14 * 8 + 8) = uVar3;
        if (uVar11 == uVar6) {
          uVar9 = uVar13;
        }
      }
      BucketNo = (uint)uVar9;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar2);
  }
  free(this->TheTable);
  this->TheTable = ppSVar8;
  this->NumBuckets = uVar7;
  this->NumTombstones = 0;
  return BucketNo;
}

Assistant:

unsigned StringMapImpl::RehashTable(unsigned BucketNo) {
  unsigned NewSize;
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  // If the hash table is now more than 3/4 full, or if fewer than 1/8 of
  // the buckets are empty (meaning that many are filled with tombstones),
  // grow/rehash the table.
  if (LLVM_UNLIKELY(NumItems * 4 > NumBuckets * 3)) {
    NewSize = NumBuckets*2;
  } else if (LLVM_UNLIKELY(NumBuckets - (NumItems + NumTombstones) <=
                           NumBuckets / 8)) {
    NewSize = NumBuckets;
  } else {
    return BucketNo;
  }

  unsigned NewBucketNo = BucketNo;
  // Allocate one extra bucket which will always be non-empty.  This allows the
  // iterators to stop at end.
  auto NewTableArray = static_cast<StringMapEntryBase **>(
      safe_calloc(NewSize+1, sizeof(StringMapEntryBase *) + sizeof(unsigned)));

  unsigned *NewHashArray = (unsigned *)(NewTableArray + NewSize + 1);
  NewTableArray[NewSize] = (StringMapEntryBase*)2;

  // Rehash all the items into their new buckets.  Luckily :) we already have
  // the hash values available, so we don't have to rehash any strings.
  for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
    StringMapEntryBase *Bucket = TheTable[I];
    if (Bucket && Bucket != getTombstoneVal()) {
      // Fast case, bucket available.
      unsigned FullHash = HashTable[I];
      unsigned NewBucket = FullHash & (NewSize-1);
      if (!NewTableArray[NewBucket]) {
        NewTableArray[FullHash & (NewSize-1)] = Bucket;
        NewHashArray[FullHash & (NewSize-1)] = FullHash;
        if (I == BucketNo)
          NewBucketNo = NewBucket;
        continue;
      }

      // Otherwise probe for a spot.
      unsigned ProbeSize = 1;
      do {
        NewBucket = (NewBucket + ProbeSize++) & (NewSize-1);
      } while (NewTableArray[NewBucket]);

      // Finally found a slot.  Fill it in.
      NewTableArray[NewBucket] = Bucket;
      NewHashArray[NewBucket] = FullHash;
      if (I == BucketNo)
        NewBucketNo = NewBucket;
    }
  }

  free(TheTable);

  TheTable = NewTableArray;
  NumBuckets = NewSize;
  NumTombstones = 0;
  return NewBucketNo;
}